

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QFileSystemModel::sibling
          (QModelIndex *__return_storage_ptr__,QFileSystemModel *this,int row,int column,
          QModelIndex *idx)

{
  quintptr qVar1;
  int iVar2;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (idx->r == row) {
    QModelIndex::parent(&local_50,idx);
    iVar2 = (**(code **)(*(long *)this + 0x80))(this,&local_50);
    if (column < iVar2) {
      qVar1 = idx->i;
      __return_storage_ptr__->r = row;
      __return_storage_ptr__->c = column;
      __return_storage_ptr__->i = qVar1;
      (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
      goto LAB_0056daf5;
    }
  }
  QAbstractItemModel::sibling((int)__return_storage_ptr__,(int)this,(QModelIndex *)(ulong)(uint)row)
  ;
LAB_0056daf5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QFileSystemModel::sibling(int row, int column, const QModelIndex &idx) const
{
    if (row == idx.row() && column < columnCount(idx.parent())) {
        // cheap sibling operation: just adjust the column:
        return createIndex(row, column, idx.internalPointer());
    } else {
        // for anything else: call the default implementation
        // (this could probably be optimized, too):
        return QAbstractItemModel::sibling(row, column, idx);
    }
}